

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int TIFFReadRGBATileExt(TIFF *tif,uint32_t col,uint32_t row,uint32_t *raster,int stop_on_error)

{
  uint32_t *__dest;
  uint w;
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  char *fmt;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint h;
  uint32_t tile_ysize;
  uint32_t tile_xsize;
  TIFFRGBAImage img;
  char emsg [1024];
  uint local_508;
  uint local_504;
  ulong local_500;
  uint local_4f8;
  int local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint32_t *local_4e8;
  ulong local_4e0;
  size_t local_4d8;
  ulong local_4d0;
  TIFFRGBAImage local_4c8;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar2 = TIFFIsTiled(tif);
  if (iVar2 == 0) {
    pcVar3 = TIFFFileName(tif);
    fmt = "Can\'t use TIFFReadRGBATile() with striped file.";
  }
  else {
    local_500 = (ulong)row;
    TIFFGetFieldDefaulted(tif,0x142,&local_504);
    TIFFGetFieldDefaulted(tif,0x143,&local_508);
    if ((col % local_504 == 0) && ((int)((local_500 & 0xffffffff) % (ulong)local_508) == 0)) {
      iVar2 = TIFFRGBAImageOK(tif,local_438);
      if ((iVar2 == 0) ||
         (iVar2 = TIFFRGBAImageBegin(&local_4c8,tif,stop_on_error,local_438), iVar2 == 0)) {
        pcVar3 = TIFFFileName(tif);
        TIFFErrorExtR(tif,pcVar3,"%s",local_438);
        return 0;
      }
      local_4c8.row_offset = (int)local_500;
      uVar6 = local_508 + local_4c8.row_offset;
      local_4f0 = local_4c8.height;
      h = local_4c8.height - local_4c8.row_offset;
      if (uVar6 <= local_4c8.height) {
        h = local_508;
      }
      w = local_4c8.width - col;
      if (local_504 + col <= local_4c8.width) {
        w = local_504;
      }
      local_4c8.col_offset = col;
      iVar2 = TIFFRGBAImageGet(&local_4c8,raster,w,h);
      TIFFRGBAImageEnd(&local_4c8);
      if ((w == local_504) && (h == local_508)) {
        return iVar2;
      }
      if (h != 0) {
        local_4d8 = (ulong)w * 4;
        local_4e0 = (ulong)h;
        iVar4 = -1;
        uVar5 = 0;
        local_4f8 = uVar6;
        local_4f4 = iVar2;
        local_4ec = w;
        local_4e8 = raster;
        local_4d0 = (ulong)w;
        do {
          uVar1 = local_4d0;
          uVar6 = local_504;
          __dest = local_4e8 + (ulong)(local_508 + iVar4) * (ulong)local_504;
          memmove(__dest,local_4e8 + (h + iVar4) * local_4d0,local_4d8);
          _TIFFmemset(__dest + uVar1,0,(ulong)(uVar6 - local_4ec) << 2);
          uVar5 = uVar5 + 1;
          iVar4 = iVar4 + -1;
          raster = local_4e8;
          iVar2 = local_4f4;
          uVar6 = local_4f8;
        } while (uVar5 < local_4e0);
      }
      if (local_508 <= h) {
        return iVar2;
      }
      if (local_4f0 < uVar6) {
        uVar6 = local_4f0;
      }
      iVar4 = ~uVar6 + (int)local_500;
      do {
        _TIFFmemset(raster + (ulong)(local_508 + iVar4) * (ulong)local_504,0,(ulong)local_504 << 2);
        h = h + 1;
        iVar4 = iVar4 + -1;
      } while (h < local_508);
      return iVar2;
    }
    pcVar3 = TIFFFileName(tif);
    fmt = "Row/col passed to TIFFReadRGBATile() must be topleft corner of a tile.";
  }
  TIFFErrorExtR(tif,pcVar3,fmt);
  return 0;
}

Assistant:

int TIFFReadRGBATileExt(TIFF *tif, uint32_t col, uint32_t row, uint32_t *raster,
                        int stop_on_error)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t tile_xsize, tile_ysize;
    uint32_t read_xsize, read_ysize;
    uint32_t i_row;

    /*
     * Verify that our request is legal - on a tile file, and on a
     * tile boundary.
     */

    if (!TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBATile() with striped file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_TILEWIDTH, &tile_xsize);
    TIFFGetFieldDefaulted(tif, TIFFTAG_TILELENGTH, &tile_ysize);
    if ((col % tile_xsize) != 0 || (row % tile_ysize) != 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Row/col passed to TIFFReadRGBATile() must be top"
                      "left corner of a tile.");
        return (0);
    }

    /*
     * Setup the RGBA reader.
     */

    if (!TIFFRGBAImageOK(tif, emsg) ||
        !TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        return (0);
    }

    /*
     * The TIFFRGBAImageGet() function doesn't allow us to get off the
     * edge of the image, even to fill an otherwise valid tile.  So we
     * figure out how much we can read, and fix up the tile buffer to
     * a full tile configuration afterwards.
     */

    if (row + tile_ysize > img.height)
        read_ysize = img.height - row;
    else
        read_ysize = tile_ysize;

    if (col + tile_xsize > img.width)
        read_xsize = img.width - col;
    else
        read_xsize = tile_xsize;

    /*
     * Read the chunk of imagery.
     */

    img.row_offset = row;
    img.col_offset = col;

    ok = TIFFRGBAImageGet(&img, raster, read_xsize, read_ysize);

    TIFFRGBAImageEnd(&img);

    /*
     * If our read was incomplete we will need to fix up the tile by
     * shifting the data around as if a full tile of data is being returned.
     *
     * This is all the more complicated because the image is organized in
     * bottom to top format.
     */

    if (read_xsize == tile_xsize && read_ysize == tile_ysize)
        return (ok);

    for (i_row = 0; i_row < read_ysize; i_row++)
    {
        memmove(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize,
                raster + (size_t)(read_ysize - i_row - 1) * read_xsize,
                read_xsize * sizeof(uint32_t));
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize +
                        read_xsize,
                    0, sizeof(uint32_t) * (tile_xsize - read_xsize));
    }

    for (i_row = read_ysize; i_row < tile_ysize; i_row++)
    {
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize, 0,
                    sizeof(uint32_t) * tile_xsize);
    }

    return (ok);
}